

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_examples.cpp
# Opt level: O2

void density_tests::
     LfQueueSamples<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
     ::samples(ostream *param_1)

{
  LfQueueControl *pLVar1;
  uintptr_t uVar2;
  void *pvVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  value_type *pvVar6;
  undefined8 *puVar7;
  runtime_type<> *prVar8;
  MessageInABottle *pMVar9;
  ostream *poVar10;
  int *piVar11;
  consume_operation consume;
  LfQueue queue;
  string my_string;
  reentrant_put_transaction<void> put_3;
  reentrant_consume_operation consume1;
  reentrant_consume_operation consume2;
  double pi;
  put_transaction<MessageInABottle> local_220;
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  local_200;
  undefined1 local_180 [16];
  undefined1 local_170 [160];
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  reentrant_consume_operation local_b0;
  reentrant_put_transaction<void> local_98;
  undefined8 local_78 [10];
  
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  local_180._0_4_ = 0x13;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_200,(int *)local_180);
  local_180._0_4_ = 8;
  local_220.m_put.m_control_block =
       (LfQueueControl *)CONCAT71(local_220.m_put.m_control_block._1_7_,0x2a);
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<std::__cxx11::string,int,char>
            ((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_200,(int *)local_180,(char *)&local_220);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::try_start_consume((consume_operation *)&local_220,
                      (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       *)&local_200);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::element<int>((consume_operation *)&local_220);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::commit((consume_operation *)&local_220);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::try_start_consume((consume_operation *)local_180,
                      (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       *)&local_200);
  pvVar3 = local_220.m_put.m_user_storage;
  uVar2 = local_220.m_put.m_next_ptr;
  pLVar1 = local_220.m_put.m_control_block;
  local_220.m_put.m_control_block = (LfQueueControl *)local_180._0_8_;
  local_220.m_put.m_next_ptr = local_180._8_8_;
  local_180._0_8_ = pLVar1;
  local_180._8_8_ = uVar2;
  local_220.m_put.m_user_storage = (void *)local_170._0_8_;
  local_170._0_8_ = pvVar3;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::~consume_operation((consume_operation *)local_180);
  pbVar5 = density::
           lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
           ::consume_operation::element<std::__cxx11::string>((consume_operation *)&local_220);
  std::__cxx11::string::string((string *)local_180,(string *)pbVar5);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::commit((consume_operation *)&local_220);
  std::__cxx11::string::~string((string *)local_180);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::~consume_operation((consume_operation *)&local_220);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::
  start_emplace<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle>
            (&local_220,
             (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_200);
  local_180._0_8_ = local_220.m_put.m_control_block;
  local_180._8_8_ = local_220.m_put.m_next_ptr;
  local_170._0_8_ = local_220.m_put.m_user_storage;
  local_170._8_8_ = local_220.m_queue;
  local_220.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<MessageInABottle>::~put_transaction(&local_220);
  pvVar6 = density::
           lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::put_transaction<MessageInABottle>::raw_allocate_copy<char[13]>
                     ((put_transaction<MessageInABottle> *)local_180,(char (*) [13])"Hello world!");
  puVar7 = (undefined8 *)
           density::
           lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::put_transaction<MessageInABottle>::element_ptr
                     ((put_transaction<MessageInABottle> *)local_180);
  *puVar7 = pvVar6;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<MessageInABottle>::commit((put_transaction<MessageInABottle> *)local_180);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::try_start_consume((consume_operation *)&local_220,
                      (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       *)&local_200);
  prVar8 = density::
           lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           ::consume_operation::complete_type((consume_operation *)&local_220);
  if (prVar8->m_feature_table ==
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
      ::s_table) {
    pbVar5 = density::
             lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
             ::consume_operation::element<std::__cxx11::string>((consume_operation *)&local_220);
    poVar10 = std::operator<<((ostream *)&std::cout,(string *)pbVar5);
  }
  else {
    prVar8 = density::
             lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::consume_operation::complete_type((consume_operation *)&local_220);
    if (prVar8->m_feature_table !=
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle>
        ::s_table) goto LAB_00f15656;
    pMVar9 = density::
             lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
             ::consume_operation::
             element<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::samples(std::ostream&)::MessageInABottle>
                       ((consume_operation *)&local_220);
    poVar10 = std::operator<<((ostream *)&std::cout,pMVar9->m_text);
  }
  std::endl<char,std::char_traits<char>>(poVar10);
LAB_00f15656:
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::commit((consume_operation *)&local_220);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::~consume_operation((consume_operation *)&local_220);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::put_transaction<MessageInABottle>::~put_transaction
            ((put_transaction<MessageInABottle> *)local_180);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)&local_200);
  if (!bVar4) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x97e,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  local_180._0_8_ = local_170;
  local_180._8_8_ = (__pointer_type)0x0;
  local_170._0_8_ = local_170._0_8_ & 0xffffffffffffff00;
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::emplace<std::__cxx11::string,std::__cxx11::string>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
              *)&local_200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  std::__cxx11::string::~string((string *)local_180);
  local_180._0_8_ =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
        *)0x4010000000000000;
  local_180._8_4_ = 1;
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::emplace<std::pair<double,int>,std::pair<double,int>>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
              *)&local_200,(pair<double,_int> *)local_180);
  density::detail::
  LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  ::LFQueue_Head((LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
                  *)local_180,
                 (LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
                  *)&local_200);
  bVar4 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                   *)&local_200);
  if (!bVar4) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x991,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  bVar4 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                   *)local_180);
  if (bVar4) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x992,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)local_180);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)&local_200);
  if (!bVar4) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x99f,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)&local_200);
  if (!bVar4) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9ad,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  std::__cxx11::string::string((string *)local_180,"abc",(allocator *)&local_220);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<std::__cxx11::string,std::__cxx11::string>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  std::__cxx11::string::~string((string *)local_180);
  local_180._0_8_ =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
        *)0x4010000000000000;
  local_180._8_4_ = 1;
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<std::pair<double,int>,std::pair<double,int>>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)&local_200,(pair<double,_int> *)local_180);
  local_180._0_8_ =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
        *)0xffc0;
  local_180._8_8_ = (__pointer_type)0x0;
  local_170._48_8_ = (__pointer_type)0x0;
  density::detail::swap
            ((LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
              *)local_180,
             (LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
              *)&local_200);
  bVar4 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)&local_200);
  if (!bVar4) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9c8,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  bVar4 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)local_180);
  if (bVar4) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x9ca,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)local_180);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  local_180._0_8_ =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
        *)0xffc0;
  local_180._8_8_ = (__pointer_type)0x0;
  local_170._48_8_ = (__pointer_type)0x0;
  local_220.m_put.m_control_block._0_4_ = 1;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_200,(int *)&local_220);
  density::detail::swap
            (&local_200,
             (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
              *)local_180);
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)&local_200);
  if (!bVar4) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa03,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)local_180);
  if (bVar4) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa04,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)local_180);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  local_180._0_8_ =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
        *)0xffc0;
  local_180._8_8_ = (__pointer_type)0x0;
  local_170._48_8_ = (__pointer_type)0x0;
  local_220.m_put.m_control_block._0_4_ = 1;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_200,(int *)&local_220);
  density::detail::swap
            (&local_200,
             (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
              *)local_180);
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)&local_200);
  if (!bVar4) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa16,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)local_180);
  if (bVar4) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa17,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)local_180);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)&local_200);
  if (!bVar4) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa24,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  local_180._0_4_ = 1;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_200,(int *)local_180);
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)&local_200);
  if (bVar4) {
    __assert_fail("!queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa26,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  local_180._0_4_ = 1;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_200,(int *)local_180);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::clear((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
           *)&local_200);
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)&local_200);
  if (!bVar4) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa35,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.m_head = (ControlBlock *)0x0;
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::try_pop((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  if (bVar4) {
    __assert_fail("pop_result == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa44,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  local_180._0_4_ = 1;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_200,(int *)local_180);
  local_180._0_4_ = 2;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                      *)&local_200,(int *)local_180);
  bVar4 = density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::try_pop((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
  if (bVar4) {
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::try_start_consume((consume_operation *)local_180,
                        (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                         *)&local_200);
    piVar11 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::consume_operation::element<int>((consume_operation *)local_180);
    if (*piVar11 != 2) {
      __assert_fail("consume.template element<int>() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa4c,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::commit((consume_operation *)local_180);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::~consume_operation((consume_operation *)local_180);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       *)&local_200);
    local_200.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_tail = 0xffc0;
    local_200.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_200.m_head = (ControlBlock *)0x0;
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::try_start_consume((consume_operation *)local_180,
                        (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                         *)&local_200);
    if ((void *)0xf < (ulong)local_170._0_8_) {
      __assert_fail("!consume_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa5c,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    local_220.m_put.m_control_block._0_4_ = 0x2a;
    density::
    lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                        *)&local_200,(int *)&local_220);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::try_start_consume((consume_operation *)&local_220,
                        (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                         *)&local_200);
    if (local_220.m_put.m_user_storage < (void *)0x10) {
      __assert_fail("consume_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa61,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    piVar11 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::consume_operation::element<int>((consume_operation *)&local_220);
    if (*piVar11 != 0x2a) {
      __assert_fail("consume_2.template element<int>() == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa62,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::commit((consume_operation *)&local_220);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::~consume_operation((consume_operation *)&local_220);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::~consume_operation((consume_operation *)local_180);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       *)&local_200);
    local_200.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_tail = 0xffc0;
    local_200.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_200.m_head = (ControlBlock *)0x0;
    local_180._0_8_ =
         (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          *)0x0;
    local_180._8_8_ = (__pointer_type)0x0;
    local_170._0_8_ = (void *)0x0;
    bVar4 = density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_start_consume((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                 *)&local_200,(consume_operation *)local_180);
    if ((bVar4) || ((void *)0xf < (ulong)local_170._0_8_)) {
      __assert_fail("!bool_1 && !consume_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa73,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    local_220.m_put.m_control_block =
         (LfQueueControl *)CONCAT44(local_220.m_put.m_control_block._4_4_,0x2a);
    density::
    lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                        *)&local_200,(int *)&local_220);
    local_220.m_put.m_control_block = (LfQueueControl *)0x0;
    local_220.m_put.m_next_ptr = 0;
    local_220.m_put.m_user_storage = (void *)0x0;
    bVar4 = density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_start_consume((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                 *)&local_200,(consume_operation *)&local_220);
    if ((!bVar4) || (local_220.m_put.m_user_storage < (void *)0x10)) {
      __assert_fail("consume_2 && bool_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa79,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    piVar11 = density::
              lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::consume_operation::element<int>((consume_operation *)&local_220);
    if (*piVar11 != 0x2a) {
      __assert_fail("consume_2.template element<int>() == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa7a,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::commit((consume_operation *)&local_220);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::~consume_operation((consume_operation *)&local_220);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::~consume_operation((consume_operation *)local_180);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                       *)&local_200);
    local_200.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_tail = 0xffc0;
    local_200.
    super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_200.m_head = (ControlBlock *)0x0;
    local_d0.m_put.m_control_block =
         (LfQueueControl *)CONCAT44(local_d0.m_put.m_control_block._4_4_,1);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::start_reentrant_push<int>
              ((reentrant_put_transaction<int> *)&local_220,
               (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                *)&local_200,(int *)&local_d0);
    local_180._0_8_ = local_220.m_put.m_control_block;
    local_180._8_8_ = local_220.m_put.m_next_ptr;
    local_170._0_8_ = local_220.m_put.m_user_storage;
    local_170._8_8_ = local_220.m_queue;
    local_220.m_put.m_user_storage = (void *)0x0;
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::reentrant_put_transaction<int>::~reentrant_put_transaction
              ((reentrant_put_transaction<int> *)&local_220);
    density::
    lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::start_reentrant_emplace<std::__cxx11::string,char_const(&)[13]>
              (&local_d0,
               (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                *)&local_200,(char (*) [13])"Hello world!");
    local_220.m_put.m_control_block = local_d0.m_put.m_control_block;
    local_220.m_put.m_next_ptr = local_d0.m_put.m_next_ptr;
    local_220.m_put.m_user_storage = local_d0.m_put.m_user_storage;
    local_220.m_queue = local_d0.m_queue;
    local_d0.m_put.m_user_storage = (void *)0x0;
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::
    reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~reentrant_put_transaction(&local_d0);
    local_78[0] = 0x40091eb851eb851f;
    local_b0.m_consume_data.m_queue =
         (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          *)density::detail::
            FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,double>
            ::s_table;
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::start_reentrant_dyn_push_copy
              (&local_98,
               (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                *)&local_200,(runtime_type *)&local_b0,local_78);
    local_d0.m_put.m_control_block = local_98.m_put.m_control_block;
    local_d0.m_put.m_next_ptr = local_98.m_put.m_next_ptr;
    local_d0.m_put.m_user_storage = local_98.m_put.m_user_storage;
    local_d0.m_queue = local_98.m_queue;
    local_98.m_put.m_user_storage = (void *)0x0;
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_98);
    bVar4 = density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                     *)&local_200);
    if (!bVar4) {
      __assert_fail("queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0xa91,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                   );
    }
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::
    reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::commit((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_220);
    density::
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::try_start_reentrant_consume
              ((reentrant_consume_operation *)&local_98,
               (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                *)&local_200);
    if ((void *)0xf < local_98.m_put.m_user_storage) {
      prVar8 = density::
               lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
               ::reentrant_consume_operation::complete_type
                         ((reentrant_consume_operation *)&local_98);
      if (prVar8->m_feature_table ==
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
          ::s_table) {
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::reentrant_put_transaction<int>::commit((reentrant_put_transaction<int> *)local_180);
        density::
        lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        ::try_start_reentrant_consume
                  (&local_b0,
                   (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                    *)&local_200);
        if (0xf < local_b0.m_consume_data.m_next_ptr) {
          prVar8 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   ::reentrant_consume_operation::complete_type(&local_b0);
          if (prVar8->m_feature_table ==
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_put_transaction<void>::cancel((reentrant_put_transaction<void> *)&local_d0);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_consume_operation::commit(&local_b0);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_consume_operation::commit((reentrant_consume_operation *)&local_98);
            bVar4 = density::
                    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                    ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                             *)&local_200);
            if (!bVar4) {
              __assert_fail("queue.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                            ,0xaa1,
                            "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                           );
            }
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_consume_operation::~reentrant_consume_operation(&local_b0);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_consume_operation::~reentrant_consume_operation
                      ((reentrant_consume_operation *)&local_98);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_put_transaction<void>::~reentrant_put_transaction
                      ((reentrant_put_transaction<void> *)&local_d0);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::
            reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~reentrant_put_transaction
                      ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_put_transaction<int>::~reentrant_put_transaction
                      ((reentrant_put_transaction<int> *)local_180);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                               *)&local_200);
            local_200.
            super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            .m_tail = 0xffc0;
            local_200.
            super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
            local_200.m_head = (ControlBlock *)0x0;
            bVar4 = density::
                    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                    ::try_reentrant_pop((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                         *)&local_200);
            if (bVar4) {
              __assert_fail("pop_result == false",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                            ,0xab0,
                            "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                           );
            }
            local_180._0_4_ = 1;
            density::
            lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
            ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                                *)&local_200,(int *)local_180);
            local_180._0_4_ = 2;
            density::
            lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
            ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                                *)&local_200,(int *)local_180);
            bVar4 = density::
                    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                    ::try_reentrant_pop((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                         *)&local_200);
            if (!bVar4) {
              __assert_fail("pop_result == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                            ,0xab6,
                            "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                           );
            }
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_start_reentrant_consume
                      ((reentrant_consume_operation *)local_180,
                       (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                        *)&local_200);
            piVar11 = density::
                      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                      ::reentrant_consume_operation::element<int>
                                ((reentrant_consume_operation *)local_180);
            if (*piVar11 != 2) {
              __assert_fail("consume.template element<int>() == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                            ,0xab8,
                            "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                           );
            }
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_consume_operation::commit((reentrant_consume_operation *)local_180);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_consume_operation::~reentrant_consume_operation
                      ((reentrant_consume_operation *)local_180);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                               *)&local_200);
            local_200.
            super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            .m_tail = 0xffc0;
            local_200.
            super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
            local_200.m_head = (ControlBlock *)0x0;
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_start_reentrant_consume
                      ((reentrant_consume_operation *)local_180,
                       (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                        *)&local_200);
            if ((void *)0xf < (ulong)local_170._0_8_) {
              __assert_fail("!consume_1",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                            ,0xac8,
                            "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                           );
            }
            local_220.m_put.m_control_block._0_4_ = 0x2a;
            density::
            lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
            ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                                *)&local_200,(int *)&local_220);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::try_start_reentrant_consume
                      ((reentrant_consume_operation *)&local_220,
                       (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                        *)&local_200);
            if (local_220.m_put.m_user_storage < (void *)0x10) {
              __assert_fail("consume_2",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                            ,0xacd,
                            "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                           );
            }
            piVar11 = density::
                      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                      ::reentrant_consume_operation::element<int>
                                ((reentrant_consume_operation *)&local_220);
            if (*piVar11 != 0x2a) {
              __assert_fail("consume_2.template element<int>() == 42",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                            ,0xace,
                            "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                           );
            }
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_consume_operation::commit((reentrant_consume_operation *)&local_220);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_consume_operation::~reentrant_consume_operation
                      ((reentrant_consume_operation *)&local_220);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::reentrant_consume_operation::~reentrant_consume_operation
                      ((reentrant_consume_operation *)local_180);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                               *)&local_200);
            local_200.
            super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            .m_tail = 0xffc0;
            local_200.
            super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
            .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
            local_200.m_head = (ControlBlock *)0x0;
            local_180._0_8_ =
                 (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                  *)0x0;
            local_180._8_8_ = (__pointer_type)0x0;
            local_170._0_8_ = (void *)0x0;
            bVar4 = density::
                    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                    ::try_start_reentrant_consume
                              ((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                *)&local_200,(reentrant_consume_operation *)local_180);
            if ((!bVar4) && ((ulong)local_170._0_8_ < (void *)0x10)) {
              local_220.m_put.m_control_block =
                   (LfQueueControl *)CONCAT44(local_220.m_put.m_control_block._4_4_,0x2a);
              density::
              lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                                  *)&local_200,(int *)&local_220);
              local_220.m_put.m_control_block = (LfQueueControl *)0x0;
              local_220.m_put.m_next_ptr = 0;
              local_220.m_put.m_user_storage = (void *)0x0;
              bVar4 = density::
                      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                      ::try_start_reentrant_consume
                                ((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                  *)&local_200,(reentrant_consume_operation *)&local_220);
              if ((bVar4) && ((void *)0xf < local_220.m_put.m_user_storage)) {
                piVar11 = density::
                          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                          ::reentrant_consume_operation::element<int>
                                    ((reentrant_consume_operation *)&local_220);
                if (*piVar11 == 0x2a) {
                  density::
                  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  ::reentrant_consume_operation::commit((reentrant_consume_operation *)&local_220);
                  density::
                  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  ::reentrant_consume_operation::~reentrant_consume_operation
                            ((reentrant_consume_operation *)&local_220);
                  density::
                  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  ::reentrant_consume_operation::~reentrant_consume_operation
                            ((reentrant_consume_operation *)local_180);
                  density::
                  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                                     *)&local_200);
                  nonblocking_heterogeneous_queue_put_samples();
                  nonblocking_heterogeneous_queue_try_put_samples();
                  nonblocking_heterogeneous_queue_put_transaction_samples();
                  nonblocking_heterogeneous_queue_consume_operation_samples();
                  nonblocking_heterogeneous_queue_reentrant_put_samples();
                  nonblocking_heterogeneous_queue_reentrant_try_put_samples();
                  nonblocking_heterogeneous_queue_reentrant_put_transaction_samples();
                  nonblocking_heterogeneous_queue_reentrant_consume_operation_samples();
                  return;
                }
                __assert_fail("consume_2.template element<int>() == 42",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                              ,0xae5,
                              "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                             );
              }
              __assert_fail("consume_2 && bool_2",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                            ,0xae4,
                            "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                           );
            }
            __assert_fail("!bool_1 && !consume_1",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0xade,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                         );
          }
        }
        __assert_fail("!consume1.empty() && consume1.complete_type().template is<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                      ,0xa9b,
                      "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                     );
      }
    }
    __assert_fail("!consume2.empty() && consume2.complete_type().template is<std::string>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0xa96,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
                 );
  }
  __assert_fail("pop_result == true",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                ,0xa4a,
                "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_single, density::consistency_sequential>::samples(std::ostream &) [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_sequential]"
               );
}

Assistant:

static void samples(std::ostream &)
{
    using namespace density;

    {
        //! [lf_heter_queue put example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;
        queue.push(19); // the parameter can be an l-value or an r-value
        queue.template emplace<std::string>(8, '*'); // pushes "********"
        //! [lf_heter_queue put example 1]

        //! [lf_heter_queue example 2]
        auto consume = queue.try_start_consume();
        int  my_int  = consume.template element<int>();
        consume.commit();

        consume               = queue.try_start_consume();
        std::string my_string = consume.template element<std::string>();
        consume.commit();
        //! [lf_heter_queue example 3
        (void)my_int;
        (void)my_string;
    }

    {
        //! [lf_heter_queue put example 2]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;
        struct MessageInABottle
        {
            const char * m_text = nullptr;
        };
        auto transaction             = queue.template start_emplace<MessageInABottle>();
        transaction.element().m_text = transaction.raw_allocate_copy("Hello world!");
        transaction.commit();
        //! [lf_heter_queue put example 2]

        //! [lf_heter_queue consume example 1]
        auto consume = queue.try_start_consume();
        if (consume.complete_type().template is<std::string>())
        {
            std::cout << consume.template element<std::string>() << std::endl;
        }
        else if (consume.complete_type().template is<MessageInABottle>())
        {
            std::cout << consume.template element<MessageInABottle>().m_text << std::endl;
        }
        consume.commit();
        //! [lf_heter_queue consume example 1]
    }

    {
        //! [lf_heter_queue default_construct example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.empty());
        //! [lf_heter_queue default_construct example 1]
    }
    {
        //! [lf_heter_queue move_construct example 1]
        using MyRunTimeType = runtime_type<
          f_default_construct,
          f_copy_construct,
          f_destroy,
          f_size,
          f_alignment,
          f_equal>;

        lf_heter_queue<MyRunTimeType> queue;
        queue.push(std::string());
        queue.push(std::make_pair(4., 1));

        lf_heter_queue<MyRunTimeType> queue_1(std::move(queue));

        assert(queue.empty());
        assert(!queue_1.empty());
        //! [lf_heter_queue move_construct example 1]
    }
    {
        //! [lf_heter_queue construct_copy_alloc example 1]
        default_allocator allocator;
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue(allocator);
        assert(queue.empty());
        //! [lf_heter_queue construct_copy_alloc example 1]
    }
    {
        //! [lf_heter_queue construct_move_alloc example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        default_allocator allocator;
        LfQueue           queue(std::move(allocator));
        assert(queue.empty());
        //! [lf_heter_queue construct_move_alloc example 1]
    }
    {
        //! [lf_heter_queue move_assign example 1]
        using MyRunTimeType = runtime_type<
          f_default_construct,
          f_copy_construct,
          f_destroy,
          f_size,
          f_alignment,
          f_equal>;

        using LfQueue = lf_heter_queue<
          MyRunTimeType,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(std::string("abc"));
        queue.push(std::make_pair(4., 1));

        LfQueue queue_1;
        queue_1 = std::move(queue);

        assert(queue.empty());

        assert(!queue_1.empty());
        //! [lf_heter_queue move_assign example 1]
    }
    {
        //! [lf_heter_queue get_allocator example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.get_allocator() == default_allocator());
        //! [lf_heter_queue get_allocator example 1]
    }
    {
        //! [lf_heter_queue get_allocator_ref example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.get_allocator_ref() == default_allocator());
        //! [lf_heter_queue get_allocator_ref example 1]
    }
    {
        //! [lf_heter_queue get_allocator_ref example 2]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue      queue;
        auto const & queue_ref = queue;
        assert(queue_ref.get_allocator_ref() == default_allocator());
        //! [lf_heter_queue get_allocator_ref example 2]
        (void)queue_ref;
    }
    {
        //! [lf_heter_queue swap example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue, queue_1;
        queue.push(1);
        swap(queue, queue_1);

        assert(queue.empty());
        assert(!queue_1.empty());
        //! [lf_heter_queue swap example 1]
    }
    {
        //! [lf_heter_queue swap example 2]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue, queue_1;
        queue.push(1);
        {
            using namespace std;
            swap(queue, queue_1);
        }
        assert(queue.empty());
        assert(!queue_1.empty());
        //! [lf_heter_queue swap example 2]
    }
    {
        //! [lf_heter_queue empty example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        assert(queue.empty());
        queue.push(1);
        assert(!queue.empty());
        //! [lf_heter_queue empty example 1]
    }
    {
        //! [lf_heter_queue clear example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(1);
        queue.clear();
        assert(queue.empty());
        //! [lf_heter_queue clear example 1]
    }
    {
        //! [lf_heter_queue try_pop example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;

        bool pop_result = queue.try_pop();
        assert(pop_result == false);

        queue.push(1);
        queue.push(2);

        pop_result = queue.try_pop();
        assert(pop_result == true);
        auto consume = queue.try_start_consume();
        assert(consume.template element<int>() == 2);
        consume.commit();
        //! [lf_heter_queue try_pop example 1]
        (void)pop_result;
    }
    {
        //! [lf_heter_queue try_start_consume example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        auto    consume_1 = queue.try_start_consume();
        assert(!consume_1);

        queue.push(42);

        auto consume_2 = queue.try_start_consume();
        assert(consume_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_consume example 1]
    }
    {
        //! [lf_heter_queue try_start_consume_ example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;

        typename LfQueue::consume_operation consume_1;
        bool const                          bool_1 = queue.try_start_consume(consume_1);
        assert(!bool_1 && !consume_1);

        queue.push(42);

        typename LfQueue::consume_operation consume_2;
        auto                                bool_2 = queue.try_start_consume(consume_2);
        assert(consume_2 && bool_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_consume_ example 1]
        (void)bool_1;
        (void)bool_2;
    }
    {
        //! [lf_heter_queue reentrant example 1]
        // start 3 reentrant put transactions

        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        auto   put_1 = queue.start_reentrant_push(1);
        auto   put_2 = queue.template start_reentrant_emplace<std::string>("Hello world!");
        double pi    = 3.14;
        auto   put_3 = queue.start_reentrant_dyn_push_copy(runtime_type<>::make<double>(), &pi);
        assert(
          queue.empty()); // the queue is still empty, because no transaction has been committed

        // commit and start consuming "Hello world!"
        put_2.commit();
        auto consume2 = queue.try_start_reentrant_consume();
        assert(!consume2.empty() && consume2.complete_type().template is<std::string>());

        // commit and start consuming 1
        put_1.commit();
        auto consume1 = queue.try_start_reentrant_consume();
        assert(!consume1.empty() && consume1.complete_type().template is<int>());

        // cancel 3.14, and commit the consumes
        put_3.cancel();
        consume1.commit();
        consume2.commit();
        assert(queue.empty());

        //! [lf_heter_queue reentrant example 1]
    }
    {
        //! [lf_heter_queue try_reentrant_pop example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        bool pop_result = queue.try_reentrant_pop();
        assert(pop_result == false);

        queue.push(1);
        queue.push(2);

        pop_result = queue.try_reentrant_pop();
        assert(pop_result == true);
        auto consume = queue.try_start_reentrant_consume();
        assert(consume.template element<int>() == 2);
        consume.commit();
        //! [lf_heter_queue try_reentrant_pop example 1]
        (void)pop_result;
    }
    {
        //! [lf_heter_queue try_start_reentrant_consume example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        auto consume_1 = queue.try_start_reentrant_consume();
        assert(!consume_1);

        queue.push(42);

        auto consume_2 = queue.try_start_reentrant_consume();
        assert(consume_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_reentrant_consume example 1]
    }
    {
        //! [lf_heter_queue try_start_reentrant_consume_ example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;
        LfQueue queue;

        typename LfQueue::reentrant_consume_operation consume_1;
        bool const bool_1 = queue.try_start_reentrant_consume(consume_1);
        assert(!bool_1 && !consume_1);

        queue.push(42);

        typename LfQueue::reentrant_consume_operation consume_2;
        auto bool_2 = queue.try_start_reentrant_consume(consume_2);
        assert(consume_2 && bool_2);
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();
        //! [lf_heter_queue try_start_reentrant_consume_ example 1]
        (void)bool_2;
        (void)bool_1;
    }

    // this samples uses std::cout and std::cin
    // nonblocking_heterogeneous_queue_samples_1();

    nonblocking_heterogeneous_queue_put_samples();

    nonblocking_heterogeneous_queue_try_put_samples();

    nonblocking_heterogeneous_queue_put_transaction_samples();

    nonblocking_heterogeneous_queue_consume_operation_samples();

    nonblocking_heterogeneous_queue_reentrant_put_samples();

    nonblocking_heterogeneous_queue_reentrant_try_put_samples();

    nonblocking_heterogeneous_queue_reentrant_put_transaction_samples();

    nonblocking_heterogeneous_queue_reentrant_consume_operation_samples();
}